

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

float calculateNoise(Mat *inputImg)

{
  int i;
  int y;
  int j;
  int x;
  float fVar1;
  double dVar2;
  float local_1c;
  
  local_1c = 0.0;
  for (y = 0; y < *(int *)(inputImg + 8); y = y + 1) {
    for (x = 0; x < *(int *)(inputImg + 0xc); x = x + 1) {
      dVar2 = getVariance(inputImg,y,x);
      fVar1 = local_1c + 1.0;
      if (dVar2 <= 450.0) {
        fVar1 = local_1c;
      }
      local_1c = fVar1;
    }
  }
  return (local_1c / (float)(*(int *)(inputImg + 8) * *(int *)(inputImg + 0xc))) * 100.0;
}

Assistant:

float calculateNoise(Mat inputImg) {
    float numOfNoisy = 0.0;
    for (int i = 0; i < inputImg.rows; i ++) {
        for (int j = 0; j < inputImg.cols; j++) {
            if ( getVariance(inputImg, i, j)  > 450) {
                numOfNoisy++;
            }
        }
    }
    return  ( numOfNoisy / (inputImg.rows * inputImg.cols) ) * 100;
}